

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teleport.c
# Opt level: O1

void tele_trap(trap *trap)

{
  boolean bVar1;
  char *line;
  
  if ((u.uz.dnum != dungeon_topology.d_astral_level.dnum) && (u.uprops[0x2c].extrinsic == 0)) {
    if (u.umonnum != u.umonster) {
      bVar1 = resists_magm(&youmonst);
      if (bVar1 != '\0') goto LAB_0025a126;
    }
    bVar1 = next_to_u();
    if (bVar1 != '\0') {
      if ((trap->field_0x8 & 0x40) == 0) {
        tele((char *)0x0);
        return;
      }
      deltrap(level,trap);
      newsym((int)u.ux,(int)u.uy);
      vault_tele();
      return;
    }
    line = "You shudder for a moment.";
    goto LAB_0025a184;
  }
LAB_0025a126:
  if (u.uprops[0x2c].extrinsic == 0) {
    if (u.umonnum != u.umonster) {
      bVar1 = resists_magm(&youmonst);
      if (bVar1 != '\0') goto LAB_0025a130;
    }
  }
  else {
LAB_0025a130:
    shieldeff(u.ux,u.uy);
  }
  line = "You feel a wrenching sensation.";
LAB_0025a184:
  pline(line);
  return;
}

Assistant:

void tele_trap(struct trap *trap)
{
	if (In_endgame(&u.uz) || Antimagic) {
		if (Antimagic)
			shieldeff(u.ux, u.uy);
		pline("You feel a wrenching sensation.");
	} else if (!next_to_u()) {
		pline("You shudder for a moment.");
	} else if (trap->once) {
		deltrap(level, trap);
		newsym(u.ux,u.uy);	/* get rid of trap symbol */
		vault_tele();
	} else
		tele(NULL);
}